

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults> * __thiscall
kj::_::PromiseAwaiter<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_>::
await_resume(Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>
             *__return_storage_ptr__,
            PromiseAwaiter<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_>
            *this)

{
  SegmentReader *pSVar1;
  CapTableReader *pCVar2;
  void *pvVar3;
  WirePointer *pWVar4;
  ResponseHook *pRVar5;
  StructPointerCount SVar6;
  undefined2 uVar7;
  int iVar8;
  undefined4 uVar9;
  anon_union_64_1_a8c68091_for_NullableValue<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_>_2
  *paVar10;
  void *unaff_retaddr;
  
  PromiseAwaiterBase::awaitResumeImpl
            (&this->super_PromiseAwaiterBase,&(this->result).super_ExceptionOrValue,unaff_retaddr);
  paVar10 = (anon_union_64_1_a8c68091_for_NullableValue<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_>_2
             *)0x0;
  if ((this->result).value.ptr.isSet != false) {
    paVar10 = &(this->result).value.ptr.field_1;
  }
  pSVar1 = (paVar10->value).super_Reader._reader.segment;
  pCVar2 = (paVar10->value).super_Reader._reader.capTable;
  pvVar3 = (paVar10->value).super_Reader._reader.data;
  pWVar4 = (paVar10->value).super_Reader._reader.pointers;
  SVar6 = (((Reader *)paVar10)->_reader).pointerCount;
  uVar7 = *(undefined2 *)&(((Reader *)paVar10)->_reader).field_0x26;
  iVar8 = (((Reader *)paVar10)->_reader).nestingLimit;
  uVar9 = *(undefined4 *)&(((Reader *)paVar10)->_reader).field_0x2c;
  (__return_storage_ptr__->super_Reader)._reader.dataSize = (((Reader *)paVar10)->_reader).dataSize;
  (__return_storage_ptr__->super_Reader)._reader.pointerCount = SVar6;
  *(undefined2 *)&(__return_storage_ptr__->super_Reader)._reader.field_0x26 = uVar7;
  (__return_storage_ptr__->super_Reader)._reader.nestingLimit = iVar8;
  *(undefined4 *)&(__return_storage_ptr__->super_Reader)._reader.field_0x2c = uVar9;
  (__return_storage_ptr__->super_Reader)._reader.data = pvVar3;
  (__return_storage_ptr__->super_Reader)._reader.pointers = pWVar4;
  (__return_storage_ptr__->super_Reader)._reader.segment = pSVar1;
  (__return_storage_ptr__->super_Reader)._reader.capTable = pCVar2;
  pRVar5 = (paVar10->value).hook.ptr;
  (__return_storage_ptr__->hook).disposer = (paVar10->value).hook.disposer;
  (__return_storage_ptr__->hook).ptr = pRVar5;
  (paVar10->value).hook.ptr = (ResponseHook *)0x0;
  return __return_storage_ptr__;
}

Assistant:

KJ_NOINLINE T await_resume() {
    // This is marked noinline in order to ensure __builtin_return_address() is accurate for stack
    // trace purposes. In my experimentation, this method was not inlined anyway even in opt
    // builds, but I want to make sure it doesn't suddenly start being inlined later causing stack
    // traces to break. (I also tried always-inline, but this did not appear to cause the compiler
    // to inline the method -- perhaps a limitation of coroutines?)
#if __GNUC__
    awaitResumeImpl(result, __builtin_return_address(0));
#elif _MSC_VER
    awaitResumeImpl(result, _ReturnAddress());
#else
    #error "please implement for your compiler"
#endif
    auto value = kj::_::readMaybe(result.value);
    KJ_IASSERT(value != nullptr, "Neither exception nor value present.");
    return T(kj::mv(*value));
  }